

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Texture3DFormatCase::init(Texture3DFormatCase *this,EVP_PKEY_CTX *ctx)

{
  Texture3D *pTVar1;
  TextureFormat *format;
  PixelBufferAccess *access;
  Texture3D *local_98;
  undefined1 local_7c [8];
  TextureFormatInfo spec;
  Texture3DFormatCase *this_local;
  
  spec.lookupBias.m_data[2]._3_1_ = 0;
  if (this->m_dataType == 0) {
    local_98 = (Texture3D *)operator_new(0x70);
    spec.lookupBias.m_data[2]._3_1_ = 1;
    unique0x10000214 = local_98;
    glu::Texture3D::Texture3D
              (local_98,this->m_renderCtx,this->m_format,this->m_width,this->m_height,this->m_depth)
    ;
  }
  else {
    local_98 = (Texture3D *)operator_new(0x70);
    glu::Texture3D::Texture3D
              (local_98,this->m_renderCtx,this->m_format,this->m_dataType,this->m_width,
               this->m_height,this->m_depth);
  }
  this->m_texture = local_98;
  pTVar1 = glu::Texture3D::getRefTexture(this->m_texture);
  format = tcu::TextureLevelPyramid::getFormat(&pTVar1->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_7c,format);
  pTVar1 = glu::Texture3D::getRefTexture(this->m_texture);
  tcu::Texture3D::allocLevel(pTVar1,0);
  pTVar1 = glu::Texture3D::getRefTexture(this->m_texture);
  access = tcu::TextureLevelPyramid::getLevel(&pTVar1->super_TextureLevelPyramid,0);
  tcu::fillWithComponentGradients(access,(Vec4 *)local_7c,(Vec4 *)(spec.valueMin.m_data + 2));
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  this->m_curSlice = 0;
  return (int)this;
}

Assistant:

void Texture3DFormatCase::init (void)
{
	m_texture = m_dataType != GL_NONE
			  ? new glu::Texture3D(m_renderCtx, m_format, m_dataType, m_width, m_height, m_depth)	// Implicit internal format.
			  : new glu::Texture3D(m_renderCtx, m_format, m_width, m_height, m_depth);				// Explicit internal format.

	tcu::TextureFormatInfo spec = tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	// Fill level 0.
	m_texture->getRefTexture().allocLevel(0);
	tcu::fillWithComponentGradients(m_texture->getRefTexture().getLevel(0), spec.valueMin, spec.valueMax);

	// Initialize state.
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	m_curSlice = 0;
}